

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathCompareNodeSetValue
              (xmlXPathParserContextPtr ctxt,int inf,int strict,xmlXPathObjectPtr arg,
              xmlXPathObjectPtr val)

{
  xmlXPathObjectPtr val_local;
  xmlXPathObjectPtr arg_local;
  int strict_local;
  int inf_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (((val == (xmlXPathObjectPtr)0x0) || (arg == (xmlXPathObjectPtr)0x0)) ||
     ((arg->type != XPATH_NODESET && (arg->type != XPATH_XSLT_TREE)))) {
    ctxt_local._4_4_ = 0;
  }
  else {
    switch(val->type) {
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      ctxt_local._4_4_ = xmlXPathCompareNodeSets(ctxt,inf,strict,arg,val);
      break;
    case XPATH_BOOLEAN:
      xmlXPathValuePush(ctxt,arg);
      xmlXPathBooleanFunction(ctxt,1);
      xmlXPathValuePush(ctxt,val);
      ctxt_local._4_4_ = xmlXPathCompareValues(ctxt,inf,strict);
      break;
    case XPATH_NUMBER:
      ctxt_local._4_4_ = xmlXPathCompareNodeSetFloat(ctxt,inf,strict,arg,val);
      break;
    case XPATH_STRING:
      ctxt_local._4_4_ = xmlXPathCompareNodeSetString(ctxt,inf,strict,arg,val);
      break;
    default:
      xmlXPathReleaseObject(ctxt->context,arg);
      xmlXPathReleaseObject(ctxt->context,val);
      xmlXPathErr(ctxt,0xb);
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathCompareNodeSetValue(xmlXPathParserContextPtr ctxt, int inf, int strict,
	                    xmlXPathObjectPtr arg, xmlXPathObjectPtr val) {
    if ((val == NULL) || (arg == NULL) ||
	((arg->type != XPATH_NODESET) && (arg->type != XPATH_XSLT_TREE)))
        return(0);

    switch(val->type) {
        case XPATH_NUMBER:
	    return(xmlXPathCompareNodeSetFloat(ctxt, inf, strict, arg, val));
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    return(xmlXPathCompareNodeSets(ctxt, inf, strict, arg, val));
        case XPATH_STRING:
	    return(xmlXPathCompareNodeSetString(ctxt, inf, strict, arg, val));
        case XPATH_BOOLEAN:
	    xmlXPathValuePush(ctxt, arg);
	    xmlXPathBooleanFunction(ctxt, 1);
	    xmlXPathValuePush(ctxt, val);
	    return(xmlXPathCompareValues(ctxt, inf, strict));
	default:
            xmlXPathReleaseObject(ctxt->context, arg);
            xmlXPathReleaseObject(ctxt->context, val);
            XP_ERROR0(XPATH_INVALID_TYPE);
    }
    return(0);
}